

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt.c
# Opt level: O2

int av1_cost_coeffs_txb_laplacian
              (MACROBLOCK *x,int plane,int block,TX_SIZE tx_size,TX_TYPE tx_type,TXB_CTX *txb_ctx,
              int reduced_tx_set_used,int adjust_eob)

{
  TX_CLASS tx_class;
  char cVar1;
  ushort uVar2;
  int16_t *piVar3;
  tran_low_t *ptVar4;
  tran_low_t *ptVar5;
  tran_low_t *ptVar6;
  short *psVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  LV_MAP_COEFF_COST *txb_costs;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  bool bVar19;
  int local_48 [2];
  TXB_CTX *local_40;
  ulong local_38;
  
  uVar2 = x->plane[plane].eobs[block];
  uVar16 = (uint)uVar2;
  local_38 = (ulong)tx_type;
  if (adjust_eob != 0) {
    piVar3 = av1_scan_orders[tx_size][tx_type].scan;
    lVar18 = (long)(block << 4);
    ptVar4 = x->plane[plane].coeff;
    ptVar5 = x->plane[plane].qcoeff;
    ptVar6 = x->plane[plane].dqcoeff;
    local_40 = txb_ctx;
    iVar8 = av1_get_tx_scale(tx_size);
    psVar7 = x->plane[plane].dequant_QTX;
    iVar13 = (int)*psVar7;
    local_48[0] = (iVar13 * 0x46 + 0x40 >> 7) + iVar13;
    iVar13 = (int)psVar7[1];
    local_48[1] = (iVar13 * 0x46 + 0x40 >> 7) + iVar13;
    for (uVar17 = (ulong)uVar2; 0 < (int)uVar17; uVar17 = uVar17 - 1) {
      lVar11 = (long)piVar3[uVar17 - 1];
      uVar16 = ptVar4[lVar18 + lVar11];
      uVar12 = -uVar16;
      if (0 < (int)uVar16) {
        uVar12 = uVar16;
      }
      if (((long)local_48[lVar11 != 0] <= (long)((ulong)uVar12 << ((char)iVar8 + 1U & 0x3f))) &&
         (ptVar5[lVar18 + lVar11] != 0)) goto LAB_00307682;
      ptVar5[lVar18 + lVar11] = 0;
      ptVar6[lVar18 + lVar11] = 0;
    }
    uVar17 = 0;
LAB_00307682:
    uVar16 = (uint)uVar17;
    x->plane[plane].eobs[block] = (uint16_t)uVar17;
    txb_ctx = local_40;
  }
  uVar12 = (uint)""[tx_size] + (uint)""[tx_size] + 1 >> 1 & 0xff;
  bVar19 = plane != 0;
  txb_costs = (x->coeff_costs).coeff_costs[uVar12] + bVar19;
  if (uVar16 == 0) {
    iVar8 = (x->coeff_costs).coeff_costs[uVar12][bVar19].txb_skip_cost[txb_ctx->txb_skip_ctx][1];
  }
  else {
    tx_class = ""[local_38];
    cVar1 = ""[tx_size];
    iVar8 = txb_costs->txb_skip_cost[txb_ctx->txb_skip_ctx][0];
    iVar13 = (int)local_38;
    iVar9 = get_tx_type_cost(x,&x->e_mbd,plane,tx_size,(TX_TYPE)local_38,reduced_tx_set_used);
    iVar10 = get_eob_cost(uVar16,(x->coeff_costs).eob_costs[cVar1] + bVar19,txb_costs,tx_class);
    lVar18 = *(long *)((long)&av1_scan_orders[tx_size][0].scan + (ulong)(uint)(iVar13 << 4));
    ptVar4 = x->plane[plane].qcoeff;
    uVar2 = x->plane[plane].eobs[block];
    iVar13 = ptVar4[(long)(block << 4) + (long)*(short *)(lVar18 + -2 + (ulong)uVar2 * 2)];
    iVar15 = -iVar13;
    if (0 < iVar13) {
      iVar15 = iVar13;
    }
    iVar13 = iVar15 * 0x800 + -0x800;
    for (uVar16 = uVar2 - 2; -1 < (int)uVar16; uVar16 = uVar16 - 1) {
      uVar12 = ptVar4[(long)(block << 4) + (long)*(short *)(lVar18 + (ulong)uVar16 * 2)];
      uVar14 = -uVar12;
      if (0 < (int)uVar12) {
        uVar14 = uVar12;
      }
      uVar17 = (ulong)uVar14;
      if (0xd < uVar14) {
        uVar17 = 0xe;
      }
      iVar13 = iVar13 + costLUT[uVar17];
    }
    iVar8 = iVar9 + iVar8 + iVar10 + iVar13 + (uVar2 - 1) * 0x4e3;
  }
  return iVar8;
}

Assistant:

int av1_cost_coeffs_txb_laplacian(const MACROBLOCK *x, const int plane,
                                  const int block, const TX_SIZE tx_size,
                                  const TX_TYPE tx_type,
                                  const TXB_CTX *const txb_ctx,
                                  const int reduced_tx_set_used,
                                  const int adjust_eob) {
  const struct macroblock_plane *p = &x->plane[plane];
  int eob = p->eobs[block];

  if (adjust_eob) {
    const SCAN_ORDER *scan_order = get_scan(tx_size, tx_type);
    const int16_t *scan = scan_order->scan;
    tran_low_t *tcoeff = p->coeff + BLOCK_OFFSET(block);
    tran_low_t *qcoeff = p->qcoeff + BLOCK_OFFSET(block);
    tran_low_t *dqcoeff = p->dqcoeff + BLOCK_OFFSET(block);
    update_coeff_eob_fast(&eob, av1_get_tx_scale(tx_size), p->dequant_QTX, scan,
                          tcoeff, qcoeff, dqcoeff);
    p->eobs[block] = eob;
  }

  const TX_SIZE txs_ctx = get_txsize_entropy_ctx(tx_size);
  const PLANE_TYPE plane_type = get_plane_type(plane);
  const LV_MAP_COEFF_COST *const coeff_costs =
      &x->coeff_costs.coeff_costs[txs_ctx][plane_type];
  if (eob == 0) {
    return coeff_costs->txb_skip_cost[txb_ctx->txb_skip_ctx][1];
  }

  const MACROBLOCKD *const xd = &x->e_mbd;
  const TX_CLASS tx_class = tx_type_to_class[tx_type];

  return warehouse_efficients_txb_laplacian(
      x, plane, block, tx_size, txb_ctx, eob, plane_type, coeff_costs, xd,
      tx_type, tx_class, reduced_tx_set_used);
}